

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-run-nowait.c
# Opt level: O0

int run_test_run_nowait(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,2);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-nowait.c"
            ,0x29,"r");
    abort();
  }
  if ((long)timer_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-nowait.c"
            ,0x2a,"timer_called","==","0",(long)timer_called,"==",0);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-run-nowait.c"
            ,0x2c,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(run_nowait) {
  int r;
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r);
  ASSERT_OK(timer_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}